

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-validator.cpp
# Opt level: O1

void __thiscall
wasm::FunctionValidator::validateCallParamsAndResult<wasm::CallIndirect>
          (FunctionValidator *this,CallIndirect *curr,HeapType sigType,Expression *printable)

{
  size_t sVar1;
  Type TVar2;
  Function *func;
  bool bVar3;
  HeapTypeKind HVar4;
  size_t sVar5;
  Type *pTVar6;
  Type *pTVar7;
  ostringstream *poVar8;
  ostream *poVar9;
  ulong uVar10;
  Signature SVar11;
  HeapType local_60;
  HeapType sigType_local;
  Signature sig;
  undefined1 local_40 [8];
  Iterator __begin2;
  
  local_60.id = sigType.id;
  HVar4 = HeapType::getKind(&local_60);
  bVar3 = ValidationInfo::shouldBeTrue<wasm::Expression*>
                    (this->info,HVar4 == Func,printable,"Heap type must be a signature type",
                     (this->
                     super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
                     ).
                     super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                     .
                     super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                     .currFunction);
  if (bVar3) {
    _sigType_local = HeapType::getSignature(&local_60);
    sVar1 = (curr->operands).
            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.usedElements;
    sVar5 = wasm::Type::size((Type *)&sigType_local);
    bVar3 = ValidationInfo::shouldBeTrue<wasm::Expression*>
                      (this->info,sVar1 == sVar5,printable,"call* param number must match",
                       (this->
                       super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
                       ).
                       super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                       .
                       super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                       .currFunction);
    if (bVar3) {
      __begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
           (Type *)0x0;
      local_40 = (undefined1  [8])&sigType_local;
      pTVar6 = (Type *)wasm::Type::size((Type *)&sigType_local);
      if ((__begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent !=
           pTVar6) || (local_40 != (undefined1  [8])&sigType_local)) {
        uVar10 = 0;
        do {
          pTVar7 = wasm::Type::Iterator::operator*((Iterator *)local_40);
          if ((curr->operands).
              super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
              usedElements <= uVar10) {
            __assert_fail("index < usedElements",
                          "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/mixed_arena.h"
                          ,0xbc,
                          "T &ArenaVectorBase<ArenaVector<wasm::Expression *>, wasm::Expression *>::operator[](size_t) const [SubType = ArenaVector<wasm::Expression *>, T = wasm::Expression *]"
                         );
          }
          bVar3 = shouldBeSubType(this,(Type)((curr->operands).
                                              super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                                              .data[uVar10]->type).id,(Type)pTVar7->id,printable,
                                  "call param types must match");
          if ((!bVar3) && (this->info->quiet == false)) {
            poVar8 = ValidationInfo::getStream_abi_cxx11_
                               (this->info,
                                (this->
                                super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
                                ).
                                super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                                .
                                super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                                .currFunction);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar8,"(on argument ",0xd);
            poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
            std::__ostream_insert<char,std::char_traits<char>>(poVar9,")\n",2);
          }
          uVar10 = uVar10 + 1;
          __begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
               (Type *)((long)&(__begin2.
                                super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                               parent)->id + 1);
        } while ((__begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                  parent != pTVar6) || (local_40 != (undefined1  [8])&sigType_local));
      }
      TVar2.id = (curr->super_SpecificExpression<(wasm::Expression::Id)7>).super_Expression.type.id;
      if (curr->isReturn == false) {
        ValidationInfo::shouldBeEqualOrFirstIsUnreachable<wasm::Expression*,wasm::Type>
                  (this->info,TVar2,sig.params,printable,"call* type must match callee return type",
                   (this->
                   super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
                   ).
                   super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                   .
                   super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                   .currFunction);
      }
      else {
        ValidationInfo::shouldBeEqual<wasm::Expression*,wasm::Type>
                  (this->info,TVar2,(Type)0x1,printable,"return_call* should have unreachable type",
                   (this->
                   super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
                   ).
                   super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                   .
                   super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                   .currFunction);
        func = (this->
               super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
               ).
               super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
               .super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
               .currFunction;
        bVar3 = ValidationInfo::shouldBeTrue<wasm::CallIndirect*>
                          (this->info,func != (Function *)0x0,curr,"function not defined",func);
        if (bVar3) {
          TVar2.id = sig.params.id;
          SVar11 = HeapType::getSignature(&func->type);
          shouldBeSubType(this,TVar2,SVar11.results.id,printable,
                          "return_call* callee return type must match caller return type");
        }
      }
    }
  }
  return;
}

Assistant:

void validateCallParamsAndResult(T* curr,
                                   HeapType sigType,
                                   Expression* printable) {
    if (!shouldBeTrue(sigType.isSignature(),
                      printable,
                      "Heap type must be a signature type")) {
      return;
    }
    auto sig = sigType.getSignature();
    if (!shouldBeTrue(curr->operands.size() == sig.params.size(),
                      printable,
                      "call* param number must match")) {
      return;
    }
    size_t i = 0;
    for (const auto& param : sig.params) {
      if (!shouldBeSubType(curr->operands[i]->type,
                           param,
                           printable,
                           "call param types must match") &&
          !info.quiet) {
        getStream() << "(on argument " << i << ")\n";
      }
      ++i;
    }
    if (curr->isReturn) {
      shouldBeEqual(curr->type,
                    Type(Type::unreachable),
                    printable,
                    "return_call* should have unreachable type");
      auto* func = getFunction();
      if (!shouldBeTrue(!!func, curr, "function not defined")) {
        return;
      }
      shouldBeSubType(
        sig.results,
        func->getResults(),
        printable,
        "return_call* callee return type must match caller return type");
    } else {
      shouldBeEqualOrFirstIsUnreachable(
        curr->type,
        sig.results,
        printable,
        "call* type must match callee return type");
    }
  }